

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManAnalyze(Cbs2_Man_t *p,int Level,int iVar,int iFan0,int iFan1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Cbs2_Que_t *p_00;
  int *piVar4;
  int nLits;
  int *pLits;
  int i;
  Cbs2_Que_t *pQue;
  int iFan1_local;
  int iFan0_local;
  int iVar_local;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  p_00 = &p->pClauses;
  iVar1 = Cbs2_VarIsAssigned(p,iVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x310,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
  }
  iVar1 = Cbs2_QueIsEmpty(p_00);
  if (iVar1 == 0) {
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x311,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
  }
  Cbs2_QuePush(p_00,0);
  Cbs2_QuePush(p_00,0);
  if (iFan0 == 0) {
    iVar1 = Cbs2_ClauseSize(p,iFan1);
    if (iFan1 == 0) {
      __assert_fail("iFan1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,800,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    Cbs2_QueGrow(p_00,iVar1);
    piVar4 = Cbs2_ClauseLits(p,iFan1);
    iVar2 = Abc_Lit2Var(*piVar4);
    if (iVar != iVar2) {
      __assert_fail("iVar == Abc_Lit2Var(pLits[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x323,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    iVar2 = Cbs2_VarValue(p,iVar);
    iVar3 = Abc_LitIsCompl(*piVar4);
    if (iVar2 != iVar3) {
      __assert_fail("Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x324,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    for (pLits._4_4_ = 0; pLits._4_4_ < iVar1; pLits._4_4_ = pLits._4_4_ + 1) {
      iVar2 = Abc_Lit2Var(piVar4[pLits._4_4_]);
      Cbs2_QuePush(p_00,iVar2);
    }
  }
  else {
    iVar1 = Cbs2_VarIsAssigned(p,iFan0);
    if (iVar1 == 0) {
      __assert_fail("Cbs2_VarIsAssigned(p, iFan0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x316,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    if ((iFan1 != 0) && (iVar1 = Cbs2_VarIsAssigned(p,iFan1), iVar1 == 0)) {
      __assert_fail("iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x317,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    Cbs2_QuePush(p_00,iVar);
    Cbs2_QuePush(p_00,iFan0);
    if (iFan1 != 0) {
      Cbs2_QuePush(p_00,iFan1);
    }
  }
  iVar1 = Cbs2_ManDeriveReason(p,Level);
  return iVar1;
}

Assistant:

static inline int Cbs2_ManAnalyze( Cbs2_Man_t * p, int Level, int iVar, int iFan0, int iFan1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses); 
    assert( Cbs2_VarIsAssigned(p, iVar) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
    if ( iFan0 ) // circuit conflict
    {
        assert( Cbs2_VarIsAssigned(p, iFan0) );
        assert( iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1) );
        Cbs2_QuePush( pQue, iVar );
        Cbs2_QuePush( pQue, iFan0 );
        if ( iFan1 )
        Cbs2_QuePush( pQue, iFan1 );
    }
    else // clause conflict
    {
        int i, * pLits, nLits = Cbs2_ClauseSize( p, iFan1 );
        assert( iFan1 );
        Cbs2_QueGrow( pQue, nLits );
        pLits = Cbs2_ClauseLits( p, iFan1 );
        assert( iVar == Abc_Lit2Var(pLits[0]) );
        assert( Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0]) );
        for ( i = 0; i < nLits; i++ )
            Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
    }
    return Cbs2_ManDeriveReason( p, Level );
}